

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccesscache.cpp
# Opt level: O2

void __thiscall QNetworkAccessCache::releaseEntry(QNetworkAccessCache *this,QByteArray *key)

{
  int *piVar1;
  Node *pNVar2;
  char *pcVar3;
  long in_FS_OFFSET;
  char local_40 [24];
  char *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pNVar2 = QHash<QByteArray,_QNetworkAccessCache::Node_*>::value
                     ((QHash<QByteArray,_QNetworkAccessCache::Node_*> *)(this + 0x10),key);
  if (pNVar2 == (Node *)0x0) {
    local_40[0] = '\x02';
    local_40[1] = '\0';
    local_40[2] = '\0';
    local_40[3] = '\0';
    local_40[4] = '\0';
    local_40[5] = '\0';
    local_40[6] = '\0';
    local_40[7] = '\0';
    local_40[8] = '\0';
    local_40[9] = '\0';
    local_40[10] = '\0';
    local_40[0xb] = '\0';
    local_40[0xc] = '\0';
    local_40[0xd] = '\0';
    local_40[0xe] = '\0';
    local_40[0xf] = '\0';
    local_40[0x10] = '\0';
    local_40[0x11] = '\0';
    local_40[0x12] = '\0';
    local_40[0x13] = '\0';
    local_40[0x14] = '\0';
    local_40[0x15] = '\0';
    local_40[0x16] = '\0';
    local_40[0x17] = '\0';
    local_28 = "default";
    pcVar3 = (key->d).ptr;
    if (pcVar3 == (char *)0x0) {
      pcVar3 = (char *)&QByteArray::_empty;
    }
    QMessageLogger::warning
              (local_40,
               "QNetworkAccessCache::releaseEntry: trying to release key \'%s\' that is not in cache"
               ,pcVar3);
  }
  else {
    piVar1 = &pNVar2->useCount;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      if (pNVar2->object->expires == true) {
        linkEntry(this,key);
      }
      if (*(Node **)(this + 0x18) == pNVar2) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          updateTimer(this);
          return;
        }
        goto LAB_0017485d;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
LAB_0017485d:
  __stack_chk_fail();
}

Assistant:

void QNetworkAccessCache::releaseEntry(const QByteArray &key)
{
    Node *node = hash.value(key);
    if (!node) {
        qWarning("QNetworkAccessCache::releaseEntry: trying to release key '%s' that is not in cache", key.constData());
        return;
    }

    Q_ASSERT(node->useCount > 0);

    if (!--node->useCount) {
        // no objects waiting; add it back to the expiry list
        if (node->object->expires)
            linkEntry(key);

        if (firstExpiringNode == node)
            updateTimer();
    }
}